

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image.h
# Opt level: O2

work_t __thiscall
gimage::Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_>::maxValue
          (Image<unsigned_short,_gimage::PixelTraits<unsigned_short>_> *this)

{
  uint uVar1;
  long lVar2;
  long i;
  long lVar3;
  
  lVar3 = this->n;
  lVar2 = -lVar3;
  if (0 < lVar3) {
    lVar2 = lVar3;
  }
  uVar1 = 0;
  for (lVar3 = 0; lVar2 != lVar3; lVar3 = lVar3 + 1) {
    if (uVar1 <= this->pixel[lVar3]) {
      uVar1 = (uint)this->pixel[lVar3];
    }
  }
  return uVar1;
}

Assistant:

work_t maxValue() const
    {
      work_t ret=ptraits::minValue();

      long pn=std::abs(n);
      for (long i=0; i<pn; i++)
      {
        if (isValidS(pixel[i]))
        {
          ret=std::max(ret, static_cast<work_t>(pixel[i]));
        }
      }

      return ret;
    }